

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::scanReset(DGXMLScanner *this,InputSource *src)

{
  XMLValidator *pXVar1;
  MemoryManager *pMVar2;
  uint uVar3;
  int iVar4;
  DTDGrammar *this_00;
  XMLReader *reader;
  undefined4 extraout_var;
  RuntimeException *pRVar5;
  undefined4 extraout_var_00;
  XMLSize_t XVar6;
  XMLReader *newReader;
  InputSource *src_local;
  DGXMLScanner *this_local;
  
  GrammarResolver::cacheGrammarFromParse
            ((this->super_XMLScanner).fGrammarResolver,
             (bool)((this->super_XMLScanner).fToCacheGrammar & 1));
  GrammarResolver::useCachedGrammarInParse
            ((this->super_XMLScanner).fGrammarResolver,
             (bool)((this->super_XMLScanner).fUseCachedGrammar & 1));
  this_00 = (DTDGrammar *)
            XMemory::operator_new(0x40,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  DTDGrammar::DTDGrammar(this_00,(this->super_XMLScanner).fGrammarPoolMemoryManager);
  this->fDTDGrammar = this_00;
  GrammarResolver::putGrammar
            ((this->super_XMLScanner).fGrammarResolver,&this->fDTDGrammar->super_Grammar);
  (this->super_XMLScanner).fGrammar = &this->fDTDGrammar->super_Grammar;
  (this->super_XMLScanner).fRootGrammar = (Grammar *)0x0;
  pXVar1 = (this->super_XMLScanner).fValidator;
  (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_XMLScanner).fGrammar);
  (this->super_XMLScanner).fValidate =
       (bool)(-((this->super_XMLScanner).fValScheme == Val_Always) & 1);
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    (*((this->super_XMLScanner).fDocHandler)->_vptr_XMLDocumentHandler[9])();
  }
  if ((this->super_XMLScanner).fEntityHandler != (XMLEntityHandler *)0x0) {
    (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[4])();
  }
  if ((this->super_XMLScanner).fErrorReporter != (XMLErrorReporter *)0x0) {
    (*((this->super_XMLScanner).fErrorReporter)->_vptr_XMLErrorReporter[3])();
  }
  XMLScanner::resetValidationContext(&this->super_XMLScanner);
  pMVar2 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar2->_vptr_MemoryManager[4])(pMVar2,(this->super_XMLScanner).fRootElemName);
  (this->super_XMLScanner).fRootElemName = (XMLCh *)0x0;
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  (*(this->fDTDValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  XMLValidator::setErrorReporter
            (&this->fDTDValidator->super_XMLValidator,(this->super_XMLScanner).fErrorReporter);
  if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  reader = ReaderMgr::createReader
                     (&(this->super_XMLScanner).fReaderMgr,src,true,RefFrom_NonLiteral,Type_General,
                      Source_External,(bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader == (XMLReader *)0x0) {
    uVar3 = (*src->_vptr_InputSource[6])();
    if ((uVar3 & 1) == 0) {
      pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x30);
      iVar4 = (*src->_vptr_InputSource[5])();
      RuntimeException::RuntimeException
                (pRVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0x9a9,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_00,iVar4),
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    pRVar5 = (RuntimeException *)__cxa_allocate_exception(0x30);
    iVar4 = (*src->_vptr_InputSource[5])();
    RuntimeException::RuntimeException
              (pRVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x9a7,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var,iVar4),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(pRVar5,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  ReaderMgr::pushReader(&(this->super_XMLScanner).fReaderMgr,reader,(XMLEntityDecl *)0x0);
  if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
    XVar6 = (**(code **)(*(long *)(this->super_XMLScanner).fSecurityManager + 0x18))();
    (this->super_XMLScanner).fEntityExpansionLimit = XVar6;
    (this->super_XMLScanner).fEntityExpansionCount = 0;
  }
  if ((this->super_XMLScanner).fUIntPoolRowTotal < 0x20) {
    XMLScanner::resetUIntPool(&this->super_XMLScanner);
  }
  else {
    RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll(this->fAttDefRegistry);
    XMLScanner::recreateUIntPool(&this->super_XMLScanner);
  }
  Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  ValueVectorOf<xercesc_4_0::XMLAttr_*>::removeAllElements(this->fAttrNSList);
  return;
}

Assistant:

void DGXMLScanner::scanReset(const InputSource& src)
{

    //  This call implicitly tells us that we are going to reuse the scanner
    //  if it was previously used. So tell the validator to reset itself.
    //
    //  But, if the fUseCacheGrammar flag is set, then don't reset it.
    //
    //  NOTE:   The ReaderMgr is flushed on the way out, because that is
    //          required to insure that files are closed.
    fGrammarResolver->cacheGrammarFromParse(fToCacheGrammar);
    fGrammarResolver->useCachedGrammarInParse(fUseCachedGrammar);

    fDTDGrammar = new (fGrammarPoolMemoryManager) DTDGrammar(fGrammarPoolMemoryManager);
    fGrammarResolver->putGrammar(fDTDGrammar);
    fGrammar = fDTDGrammar;
    fRootGrammar = 0;
    fValidator->setGrammar(fGrammar);

    // Reset validation
    fValidate = (fValScheme == Val_Always) ? true : false;

    //  And for all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    // Clear out the id reference list
    resetValidationContext();

    // Reset the Root Element Name
    fMemoryManager->deallocate(fRootElemName);//delete [] fRootElemName;
    fRootElemName = 0;

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;

    // Reset the validators
    fDTDValidator->reset();
    fDTDValidator->setErrorReporter(fErrorReporter);
    if (fValidatorFromUser)
        fValidator->reset();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0)
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
    if(fUIntPoolRowTotal >= 32)
    { // 8 KB tied up with validating attributes...
        fAttDefRegistry->removeAll();
        recreateUIntPool();
    }
    else
    {
        // note that this will implicitly reset the values of the hashtables,
        // though their buckets will still be tied up
        resetUIntPool();
    }
    fUndeclaredAttrRegistry->removeAll();
    fAttrNSList->removeAllElements();
}